

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall
Clasp::ClaspFacade::SolveData::prepareEnum
          (SolveData *this,SharedContext *ctx,EnumMode mode,EnumOptions *options)

{
  bool bVar1;
  int iVar2;
  SolveAlgorithm *this_00;
  ulong uVar3;
  
  if (this->active == (SolveStrategy *)0x0) {
    bVar1 = SharedContext::ok(ctx);
    if (((bVar1) && (((uint)ctx->share_ >> 0x19 & 1) == 0)) && (this->prepared == false)) {
      if (((uint)ctx->share_ >> 0x18 & 1) != 0 && mode == enum_volatile) {
        SharedContext::requestStepVar(ctx);
      }
      OutputTable::setProjectMode(&ctx->output,options->proMode);
      uVar3 = options->numModels;
      iVar2 = Enumerator::init((Enumerator *)((this->en).ptr_ & 0xfffffffffffffffe),
                               (EVP_PKEY_CTX *)ctx);
      if (options->numModels < 0) {
        uVar3 = (long)iVar2;
      }
      if (iVar2 == 0) {
        uVar3 = (long)iVar2;
      }
      this_00 = (SolveAlgorithm *)((this->algo).ptr_ & 0xfffffffffffffffe);
      this_00->enumLimit_ = -(ulong)(uVar3 == 0) | uVar3;
      SolveAlgorithm::setOptLimit(this_00,&options->optStop);
      this->prepared = true;
    }
    return;
  }
  Potassco::fail(-2,
                 "void Clasp::ClaspFacade::SolveData::prepareEnum(SharedContext &, EnumMode, const EnumOptions &)"
                 ,0x20e,"!active","Solve operation still active",0);
}

Assistant:

void ClaspFacade::SolveData::prepareEnum(SharedContext& ctx, EnumMode mode, const EnumOptions& options) {
	POTASSCO_REQUIRE(!active, "Solve operation still active");
	if (ctx.ok() && !ctx.frozen() && !prepared) {
		if (mode == enum_volatile && ctx.solveMode() == SharedContext::solve_multi) {
			ctx.requestStepVar();
		}
		ctx.output.setProjectMode(options.proMode);
		int64 numM = options.numModels;
		int lim = en->init(ctx, options.optMode, (int)Range<int64>(-1, INT_MAX).clamp(numM));
		if (lim == 0 || options.numModels < 0) {
			numM = lim;
		}
		algo->setEnumLimit(numM ? static_cast<uint64>(numM) : UINT64_MAX);
		algo->setOptLimit(options.optStop);
		prepared = true;
	}
}